

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O2

void __thiscall
Catch::Capturer::captureValues<char[7],int,unsigned_short>
          (Capturer *this,size_t index,char (*value) [7],int *values,unsigned_short *values_1)

{
  string sStack_48;
  
  StringMaker<char[7],void>::convert_abi_cxx11_
            (&sStack_48,(StringMaker<char[7],void> *)value,*value);
  captureValue(this,index,&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  captureValues<int,unsigned_short>(this,index + 1,values,values_1);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }